

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void common_embd_normalize(float *inp,float *out,int n,int embd_norm)

{
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  ulong in_RDI;
  ulong uVar1;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  __type_conflict1 _Var2;
  int i_3;
  float norm;
  int i_2;
  int i_1;
  int i;
  double sum;
  undefined8 local_48;
  undefined4 local_34;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined8 local_20;
  
  local_20 = 0.0;
  if (in_ECX == 0xffffffff) {
    local_20 = 1.0;
  }
  else if (in_ECX == 0) {
    uVar1 = in_RDI;
    for (local_24 = 0; local_24 < in_EDX; local_24 = local_24 + 1) {
      std::abs((int)uVar1);
      if (local_20 < (double)extraout_XMM0_Da) {
        std::abs((int)uVar1);
        local_20 = (double)extraout_XMM0_Da_00;
      }
    }
    local_20 = local_20 / 32760.0;
  }
  else if (in_ECX == 2) {
    for (local_28 = 0; local_28 < in_EDX; local_28 = local_28 + 1) {
      local_20 = (double)(*(float *)(in_RDI + (long)local_28 * 4) *
                         *(float *)(in_RDI + (long)local_28 * 4)) + local_20;
    }
    local_20 = sqrt(local_20);
  }
  else {
    uVar1 = in_RDI;
    for (local_2c = 0; local_2c < in_EDX; local_2c = local_2c + 1) {
      std::abs((int)uVar1);
      uVar1 = (ulong)in_ECX;
      _Var2 = std::pow<float,int>(0.0,0x408f88);
      local_20 = _Var2 + local_20;
    }
    local_20 = pow(local_20,1.0 / (double)(int)in_ECX);
  }
  if (local_20 <= 0.0) {
    local_48 = 0.0;
  }
  else {
    local_48 = 1.0 / local_20;
  }
  for (local_34 = 0; local_34 < in_EDX; local_34 = local_34 + 1) {
    *(float *)(in_RSI + (long)local_34 * 4) =
         *(float *)(in_RDI + (long)local_34 * 4) * (float)local_48;
  }
  return;
}

Assistant:

void common_embd_normalize(const float * inp, float * out, int n, int embd_norm) {
    double sum = 0.0;

    switch (embd_norm) {
        case -1: // no normalisation
            sum = 1.0;
            break;
        case 0: // max absolute
            for (int i = 0; i < n; i++) {
                if (sum < std::abs(inp[i])) {
                    sum = std::abs(inp[i]);
                }
            }
            sum /= 32760.0; // make an int16 range
            break;
        case 2: // euclidean
            for (int i = 0; i < n; i++) {
                sum += inp[i] * inp[i];
            }
            sum = std::sqrt(sum);
            break;
        default: // p-norm (euclidean is p-norm p=2)
            for (int i = 0; i < n; i++) {
                sum += std::pow(std::abs(inp[i]), embd_norm);
            }
            sum = std::pow(sum, 1.0 / embd_norm);
            break;
    }

    const float norm = sum > 0.0 ? 1.0 / sum : 0.0f;

    for (int i = 0; i < n; i++) {
        out[i] = inp[i] * norm;
    }
}